

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonConstFuncs.cpp
# Opt level: O1

void __thiscall slang::ast::builtins::Builtins::registerNonConstFuncs(Builtins *this)

{
  PredefinedIntegerType *__args_1;
  PredefinedIntegerType *__args_1_00;
  initializer_list<const_slang::ast::Type_*> __l;
  initializer_list<const_slang::ast::Type_*> __l_00;
  initializer_list<const_slang::ast::Type_*> __l_01;
  initializer_list<const_slang::ast::Type_*> __l_02;
  initializer_list<const_slang::ast::Type_*> __l_03;
  vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> intArg;
  vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> local_408;
  KnownSystemName local_3f0;
  undefined1 local_3ea;
  allocator_type local_3e9;
  undefined8 local_3e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_3e0;
  PredefinedIntegerType *local_3d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_3d0;
  PredefinedIntegerType *local_3c8;
  int local_3b4;
  vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> local_3b0;
  shared_ptr<slang::ast::SystemSubroutine> local_398;
  shared_ptr<slang::ast::SystemSubroutine> local_388;
  shared_ptr<slang::ast::SystemSubroutine> local_378;
  shared_ptr<slang::ast::SystemSubroutine> local_368;
  shared_ptr<slang::ast::SystemSubroutine> local_358;
  shared_ptr<slang::ast::SystemSubroutine> local_348;
  shared_ptr<slang::ast::SystemSubroutine> local_338;
  shared_ptr<slang::ast::SystemSubroutine> local_328;
  shared_ptr<slang::ast::SystemSubroutine> local_318;
  shared_ptr<slang::ast::SystemSubroutine> local_308;
  shared_ptr<slang::ast::SystemSubroutine> local_2f8;
  shared_ptr<slang::ast::SystemSubroutine> local_2e8;
  shared_ptr<slang::ast::SystemSubroutine> local_2d8;
  shared_ptr<slang::ast::SystemSubroutine> local_2c8;
  shared_ptr<slang::ast::SystemSubroutine> local_2b8;
  shared_ptr<slang::ast::SystemSubroutine> local_2a8;
  shared_ptr<slang::ast::SystemSubroutine> local_298;
  shared_ptr<slang::ast::SystemSubroutine> local_288;
  shared_ptr<slang::ast::SystemSubroutine> local_278;
  shared_ptr<slang::ast::SystemSubroutine> local_268;
  shared_ptr<slang::ast::SystemSubroutine> local_258;
  shared_ptr<slang::ast::SystemSubroutine> local_248;
  shared_ptr<slang::ast::SystemSubroutine> local_238;
  shared_ptr<slang::ast::SystemSubroutine> local_228;
  shared_ptr<slang::ast::SystemSubroutine> local_218;
  shared_ptr<slang::ast::SystemSubroutine> local_208;
  shared_ptr<slang::ast::SystemSubroutine> local_1f8;
  shared_ptr<slang::ast::SystemSubroutine> local_1e8;
  shared_ptr<slang::ast::SystemSubroutine> local_1d8;
  shared_ptr<slang::ast::SystemSubroutine> local_1c8;
  shared_ptr<slang::ast::SystemSubroutine> local_1b8;
  shared_ptr<slang::ast::SystemSubroutine> local_1a8;
  shared_ptr<slang::ast::SystemSubroutine> local_198;
  shared_ptr<slang::ast::SystemSubroutine> local_188;
  shared_ptr<slang::ast::SystemSubroutine> local_178;
  shared_ptr<slang::ast::SystemSubroutine> local_168;
  shared_ptr<slang::ast::SystemSubroutine> local_158;
  shared_ptr<slang::ast::SystemSubroutine> local_148;
  shared_ptr<slang::ast::SystemSubroutine> local_138;
  shared_ptr<slang::ast::SystemSubroutine> local_128;
  shared_ptr<slang::ast::SystemSubroutine> local_118;
  shared_ptr<slang::ast::SystemSubroutine> local_108;
  shared_ptr<slang::ast::SystemSubroutine> local_f8;
  shared_ptr<slang::ast::SystemSubroutine> local_e8;
  shared_ptr<slang::ast::SystemSubroutine> local_d8;
  shared_ptr<slang::ast::SystemSubroutine> local_c8;
  shared_ptr<slang::ast::SystemSubroutine> local_b8;
  shared_ptr<slang::ast::SystemSubroutine> local_a8;
  shared_ptr<slang::ast::SystemSubroutine> local_98;
  shared_ptr<slang::ast::SystemSubroutine> local_88;
  shared_ptr<slang::ast::SystemSubroutine> local_78;
  shared_ptr<slang::ast::SystemSubroutine> local_68;
  shared_ptr<slang::ast::SystemSubroutine> local_58;
  shared_ptr<slang::ast::SystemSubroutine> local_48;
  shared_ptr<slang::ast::SystemSubroutine> local_38;
  
  __args_1 = &this->intType;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_408;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)__args_1;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            (&local_3b0,__l,(allocator_type *)&local_3d8);
  local_3d8 = (PredefinedIntegerType *)CONCAT44(local_3d8._4_4_,0x62);
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::NonConstantFunction,std::allocator<slang::ast::NonConstantFunction>,slang::parsing::KnownSystemName,slang::ast::PredefinedIntegerType&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_408.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(NonConstantFunction **)&local_408,
             (allocator<slang::ast::NonConstantFunction> *)&local_3e8,(KnownSystemName *)&local_3d8,
             &this->timeType);
  local_38.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_408.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_38.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_408.
          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
          _M_impl.super__Vector_impl_data._M_finish;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_38);
  if (local_38.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_408.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_408.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_3d8 = (PredefinedIntegerType *)CONCAT44(local_3d8._4_4_,99);
  __args_1_00 = &this->uintType;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::NonConstantFunction,std::allocator<slang::ast::NonConstantFunction>,slang::parsing::KnownSystemName,slang::ast::PredefinedIntegerType&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_408.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(NonConstantFunction **)&local_408,
             (allocator<slang::ast::NonConstantFunction> *)&local_3e8,(KnownSystemName *)&local_3d8,
             __args_1_00);
  local_48.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_408.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_48.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_408.
          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
          _M_impl.super__Vector_impl_data._M_finish;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_48);
  if (local_48.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_408.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_408.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_3d8 = (PredefinedIntegerType *)CONCAT44(local_3d8._4_4_,100);
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::NonConstantFunction,std::allocator<slang::ast::NonConstantFunction>,slang::parsing::KnownSystemName,slang::ast::FloatingType&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_408.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(NonConstantFunction **)&local_408,
             (allocator<slang::ast::NonConstantFunction> *)&local_3e8,(KnownSystemName *)&local_3d8,
             &this->realTimeType);
  local_58.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_408.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_58.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_408.
          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
          _M_impl.super__Vector_impl_data._M_finish;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_58);
  if (local_58.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_408.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_408.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_3d8 = (PredefinedIntegerType *)CONCAT44(local_3d8._4_4_,0x65);
  local_3e8 = (Type *)((ulong)local_3e8._4_4_ << 0x20);
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::NonConstantFunction,std::allocator<slang::ast::NonConstantFunction>,slang::parsing::KnownSystemName,slang::ast::PredefinedIntegerType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_408.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(NonConstantFunction **)&local_408,
             (allocator<slang::ast::NonConstantFunction> *)&local_3f0,(KnownSystemName *)&local_3d8,
             __args_1,(int *)&local_3e8,&local_3b0);
  local_68.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_408.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_68.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_408.
          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
          _M_impl.super__Vector_impl_data._M_finish;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_68);
  if (local_68.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_408.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_408.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_3d8 = (PredefinedIntegerType *)CONCAT44(local_3d8._4_4_,0x66);
  local_3e8 = (Type *)((ulong)local_3e8 & 0xffffffff00000000);
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::NonConstantFunction,std::allocator<slang::ast::NonConstantFunction>,slang::parsing::KnownSystemName,slang::ast::PredefinedIntegerType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_408.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(NonConstantFunction **)&local_408,
             (allocator<slang::ast::NonConstantFunction> *)&local_3f0,(KnownSystemName *)&local_3d8,
             __args_1_00,(int *)&local_3e8,&local_3b0);
  local_78.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_408.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_78.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_408.
          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
          _M_impl.super__Vector_impl_data._M_finish;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_78);
  if (local_78.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_408.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_408.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_3f0 = URandomRange;
  local_3b4 = 1;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&local_3e8;
  local_3e8 = (Type *)__args_1_00;
  _Stack_3e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__args_1_00;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            (&local_408,__l_00,&local_3e9);
  local_3d8 = (PredefinedIntegerType *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::NonConstantFunction,std::allocator<slang::ast::NonConstantFunction>,slang::parsing::KnownSystemName,slang::ast::PredefinedIntegerType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            (&_Stack_3d0,(NonConstantFunction **)&local_3d8,
             (allocator<slang::ast::NonConstantFunction> *)&local_3ea,&local_3f0,__args_1_00,
             &local_3b4,&local_408);
  local_88.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_3d8;
  local_88.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Stack_3d0._M_pi;
  local_3d8 = (PredefinedIntegerType *)0x0;
  _Stack_3d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_88);
  if (local_88.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (_Stack_3d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_3d0._M_pi);
  }
  if (local_408.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_408.
                    super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_408.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_408.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_3f0 = FOpen;
  local_3b4 = 1;
  local_3e8 = &(this->stringType).super_Type;
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)&local_3e8;
  _Stack_3e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3e8;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            (&local_408,__l_01,&local_3e9);
  local_3d8 = (PredefinedIntegerType *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::NonConstantFunction,std::allocator<slang::ast::NonConstantFunction>,slang::parsing::KnownSystemName,slang::ast::PredefinedIntegerType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            (&_Stack_3d0,(NonConstantFunction **)&local_3d8,
             (allocator<slang::ast::NonConstantFunction> *)&local_3ea,&local_3f0,__args_1,&local_3b4
             ,&local_408);
  local_98.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_3d8;
  local_98.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Stack_3d0._M_pi;
  local_3d8 = (PredefinedIntegerType *)0x0;
  _Stack_3d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_98);
  if (local_98.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (_Stack_3d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_3d0._M_pi);
  }
  if (local_408.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_408.
                    super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_408.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_408.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_3d8 = (PredefinedIntegerType *)CONCAT44(local_3d8._4_4_,0x46);
  local_3e8 = (Type *)CONCAT44(local_3e8._4_4_,1);
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::NonConstantFunction,std::allocator<slang::ast::NonConstantFunction>,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_408.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(NonConstantFunction **)&local_408,
             (allocator<slang::ast::NonConstantFunction> *)&local_3f0,(KnownSystemName *)&local_3d8,
             &this->voidType,(int *)&local_3e8,&local_3b0);
  local_a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_408.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_408.
          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
          _M_impl.super__Vector_impl_data._M_finish;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_a8);
  if (local_a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_408.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_408.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_3d8 = (PredefinedIntegerType *)CONCAT44(local_3d8._4_4_,0x47);
  local_3e8 = (Type *)CONCAT44(local_3e8._4_4_,1);
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::NonConstantFunction,std::allocator<slang::ast::NonConstantFunction>,slang::parsing::KnownSystemName,slang::ast::PredefinedIntegerType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_408.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(NonConstantFunction **)&local_408,
             (allocator<slang::ast::NonConstantFunction> *)&local_3f0,(KnownSystemName *)&local_3d8,
             __args_1,(int *)&local_3e8,&local_3b0);
  local_b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_408.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_408.
          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
          _M_impl.super__Vector_impl_data._M_finish;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_b8);
  if (local_b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_408.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_408.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_3f0 = UngetC;
  local_3b4 = 2;
  __l_02._M_len = 2;
  __l_02._M_array = (iterator)&local_3e8;
  local_3e8 = (Type *)__args_1;
  _Stack_3e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__args_1;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            (&local_408,__l_02,&local_3e9);
  local_3d8 = (PredefinedIntegerType *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::NonConstantFunction,std::allocator<slang::ast::NonConstantFunction>,slang::parsing::KnownSystemName,slang::ast::PredefinedIntegerType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            (&_Stack_3d0,(NonConstantFunction **)&local_3d8,
             (allocator<slang::ast::NonConstantFunction> *)&local_3ea,&local_3f0,__args_1,&local_3b4
             ,&local_408);
  local_c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_3d8;
  local_c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Stack_3d0._M_pi;
  local_3d8 = (PredefinedIntegerType *)0x0;
  _Stack_3d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_c8);
  if (local_c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (_Stack_3d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_3d0._M_pi);
  }
  if (local_408.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_408.
                    super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_408.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_408.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_3d8 = (PredefinedIntegerType *)CONCAT44(local_3d8._4_4_,0x49);
  local_3e8 = (Type *)CONCAT44(local_3e8._4_4_,1);
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::NonConstantFunction,std::allocator<slang::ast::NonConstantFunction>,slang::parsing::KnownSystemName,slang::ast::PredefinedIntegerType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_408.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(NonConstantFunction **)&local_408,
             (allocator<slang::ast::NonConstantFunction> *)&local_3f0,(KnownSystemName *)&local_3d8,
             __args_1,(int *)&local_3e8,&local_3b0);
  local_d8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_408.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_d8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_408.
          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
          _M_impl.super__Vector_impl_data._M_finish;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_d8);
  if (local_d8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_408.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_408.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_3f0 = FSeek;
  local_3b4 = 3;
  __l_03._M_len = 3;
  __l_03._M_array = (iterator)&local_3d8;
  local_3d8 = __args_1;
  _Stack_3d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__args_1;
  local_3c8 = __args_1;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            (&local_408,__l_03,&local_3e9);
  local_3e8 = (Type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::NonConstantFunction,std::allocator<slang::ast::NonConstantFunction>,slang::parsing::KnownSystemName,slang::ast::PredefinedIntegerType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            (&_Stack_3e0,(NonConstantFunction **)&local_3e8,
             (allocator<slang::ast::NonConstantFunction> *)&local_3ea,&local_3f0,__args_1,&local_3b4
             ,&local_408);
  local_e8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_3e8;
  local_e8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Stack_3e0._M_pi;
  local_3e8 = (Type *)0x0;
  _Stack_3e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_e8);
  if (local_e8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (_Stack_3e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_3e0._M_pi);
  }
  if (local_408.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_408.
                    super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_408.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_408.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_3d8 = (PredefinedIntegerType *)CONCAT44(local_3d8._4_4_,0x4b);
  local_3e8 = (Type *)CONCAT44(local_3e8._4_4_,1);
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::NonConstantFunction,std::allocator<slang::ast::NonConstantFunction>,slang::parsing::KnownSystemName,slang::ast::PredefinedIntegerType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_408.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(NonConstantFunction **)&local_408,
             (allocator<slang::ast::NonConstantFunction> *)&local_3f0,(KnownSystemName *)&local_3d8,
             __args_1,(int *)&local_3e8,&local_3b0);
  local_f8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_408.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_f8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_408.
          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
          _M_impl.super__Vector_impl_data._M_finish;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_f8);
  if (local_f8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_408.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_408.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_3d8 = (PredefinedIntegerType *)CONCAT44(local_3d8._4_4_,0x4c);
  local_3e8 = (Type *)((ulong)local_3e8 & 0xffffffff00000000);
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::NonConstantFunction,std::allocator<slang::ast::NonConstantFunction>,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_408.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(NonConstantFunction **)&local_408,
             (allocator<slang::ast::NonConstantFunction> *)&local_3f0,(KnownSystemName *)&local_3d8,
             &this->voidType,(int *)&local_3e8,&local_3b0);
  local_108.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_408.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_108.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_408.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_108);
  if (local_108.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_108.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_408.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_408.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_3d8 = (PredefinedIntegerType *)CONCAT44(local_3d8._4_4_,0x4d);
  local_3e8 = (Type *)CONCAT44(local_3e8._4_4_,1);
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::NonConstantFunction,std::allocator<slang::ast::NonConstantFunction>,slang::parsing::KnownSystemName,slang::ast::PredefinedIntegerType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_408.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(NonConstantFunction **)&local_408,
             (allocator<slang::ast::NonConstantFunction> *)&local_3f0,(KnownSystemName *)&local_3d8,
             __args_1,(int *)&local_3e8,&local_3b0);
  local_118.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_408.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_118.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_408.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_118);
  if (local_118.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_118.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_408.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_408.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_3d8 = (PredefinedIntegerType *)CONCAT44(local_3d8._4_4_,0x68);
  local_3e8 = (Type *)((ulong)local_3e8 & 0xffffffff00000000);
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::NonConstantFunction,std::allocator<slang::ast::NonConstantFunction>,slang::parsing::KnownSystemName,slang::ast::PredefinedIntegerType&,int>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_408.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(NonConstantFunction **)&local_408,
             (allocator<slang::ast::NonConstantFunction> *)&local_3f0,(KnownSystemName *)&local_3d8,
             __args_1,(int *)&local_3e8);
  local_128.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_408.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_128.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_408.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_128);
  if (local_128.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_128.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_408.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_408.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_3d8 = (PredefinedIntegerType *)CONCAT44(local_3d8._4_4_,0x69);
  local_3e8 = (Type *)((ulong)local_3e8 & 0xffffffff00000000);
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::NonConstantFunction,std::allocator<slang::ast::NonConstantFunction>,slang::parsing::KnownSystemName,slang::ast::PredefinedIntegerType&,int>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_408.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(NonConstantFunction **)&local_408,
             (allocator<slang::ast::NonConstantFunction> *)&local_3f0,(KnownSystemName *)&local_3d8,
             __args_1,(int *)&local_3e8);
  local_138.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_408.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_138.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_408.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_138);
  if (local_138.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_138.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_408.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_408.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_3d8 = (PredefinedIntegerType *)CONCAT44(local_3d8._4_4_,0x6e);
  local_3e8 = (Type *)CONCAT44(local_3e8._4_4_,3);
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::DistributionFunc,std::allocator<slang::ast::builtins::DistributionFunc>,slang::parsing::KnownSystemName,int>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_408.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(DistributionFunc **)&local_408,
             (allocator<slang::ast::builtins::DistributionFunc> *)&local_3f0,
             (KnownSystemName *)&local_3d8,(int *)&local_3e8);
  local_148.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_408.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_148.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_408.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_148);
  if (local_148.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_148.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_408.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_408.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_3d8 = (PredefinedIntegerType *)CONCAT44(local_3d8._4_4_,0x6f);
  local_3e8 = (Type *)CONCAT44(local_3e8._4_4_,3);
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::DistributionFunc,std::allocator<slang::ast::builtins::DistributionFunc>,slang::parsing::KnownSystemName,int>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_408.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(DistributionFunc **)&local_408,
             (allocator<slang::ast::builtins::DistributionFunc> *)&local_3f0,
             (KnownSystemName *)&local_3d8,(int *)&local_3e8);
  local_158.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_408.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_158.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_408.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_158);
  if (local_158.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_158.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_408.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_408.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_3d8 = (PredefinedIntegerType *)CONCAT44(local_3d8._4_4_,0x70);
  local_3e8 = (Type *)CONCAT44(local_3e8._4_4_,2);
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::DistributionFunc,std::allocator<slang::ast::builtins::DistributionFunc>,slang::parsing::KnownSystemName,int>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_408.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(DistributionFunc **)&local_408,
             (allocator<slang::ast::builtins::DistributionFunc> *)&local_3f0,
             (KnownSystemName *)&local_3d8,(int *)&local_3e8);
  local_168.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_408.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_168.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_408.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_168);
  if (local_168.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_168.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_408.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_408.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_3d8 = (PredefinedIntegerType *)CONCAT44(local_3d8._4_4_,0x71);
  local_3e8 = (Type *)CONCAT44(local_3e8._4_4_,2);
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::DistributionFunc,std::allocator<slang::ast::builtins::DistributionFunc>,slang::parsing::KnownSystemName,int>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_408.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(DistributionFunc **)&local_408,
             (allocator<slang::ast::builtins::DistributionFunc> *)&local_3f0,
             (KnownSystemName *)&local_3d8,(int *)&local_3e8);
  local_178.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_408.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_178.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_408.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_178);
  if (local_178.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_178.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_408.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_408.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_3d8 = (PredefinedIntegerType *)CONCAT44(local_3d8._4_4_,0x72);
  local_3e8 = (Type *)CONCAT44(local_3e8._4_4_,2);
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::DistributionFunc,std::allocator<slang::ast::builtins::DistributionFunc>,slang::parsing::KnownSystemName,int>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_408.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(DistributionFunc **)&local_408,
             (allocator<slang::ast::builtins::DistributionFunc> *)&local_3f0,
             (KnownSystemName *)&local_3d8,(int *)&local_3e8);
  local_188.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_408.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_188.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_408.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_188);
  if (local_188.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_188.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_408.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_408.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_3d8 = (PredefinedIntegerType *)CONCAT44(local_3d8._4_4_,0x73);
  local_3e8 = (Type *)CONCAT44(local_3e8._4_4_,2);
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::DistributionFunc,std::allocator<slang::ast::builtins::DistributionFunc>,slang::parsing::KnownSystemName,int>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_408.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(DistributionFunc **)&local_408,
             (allocator<slang::ast::builtins::DistributionFunc> *)&local_3f0,
             (KnownSystemName *)&local_3d8,(int *)&local_3e8);
  local_198.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_408.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_198.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_408.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_198);
  if (local_198.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_198.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_408.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_408.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_3d8 = (PredefinedIntegerType *)CONCAT44(local_3d8._4_4_,0x74);
  local_3e8 = (Type *)CONCAT44(local_3e8._4_4_,3);
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::DistributionFunc,std::allocator<slang::ast::builtins::DistributionFunc>,slang::parsing::KnownSystemName,int>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_408.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(DistributionFunc **)&local_408,
             (allocator<slang::ast::builtins::DistributionFunc> *)&local_3f0,
             (KnownSystemName *)&local_3d8,(int *)&local_3e8);
  local_1a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_408.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_1a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_408.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_1a8);
  if (local_1a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1a8.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_408.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_408.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_3d8 = (PredefinedIntegerType *)CONCAT44(local_3d8._4_4_,0x4e);
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::ValueChangeFunc,std::allocator<slang::ast::builtins::ValueChangeFunc>,slang::parsing::KnownSystemName>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_408.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(ValueChangeFunc **)&local_408,
             (allocator<slang::ast::builtins::ValueChangeFunc> *)&local_3e8,
             (KnownSystemName *)&local_3d8);
  local_1b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_408.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_1b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_408.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_1b8);
  if (local_1b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1b8.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_408.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_408.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_3d8 = (PredefinedIntegerType *)CONCAT44(local_3d8._4_4_,0x4f);
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::ValueChangeFunc,std::allocator<slang::ast::builtins::ValueChangeFunc>,slang::parsing::KnownSystemName>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_408.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(ValueChangeFunc **)&local_408,
             (allocator<slang::ast::builtins::ValueChangeFunc> *)&local_3e8,
             (KnownSystemName *)&local_3d8);
  local_1c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_408.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_1c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_408.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_1c8);
  if (local_1c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1c8.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_408.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_408.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_3d8 = (PredefinedIntegerType *)CONCAT44(local_3d8._4_4_,0x50);
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::ValueChangeFunc,std::allocator<slang::ast::builtins::ValueChangeFunc>,slang::parsing::KnownSystemName>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_408.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(ValueChangeFunc **)&local_408,
             (allocator<slang::ast::builtins::ValueChangeFunc> *)&local_3e8,
             (KnownSystemName *)&local_3d8);
  local_1d8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_408.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_1d8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_408.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_1d8);
  if (local_1d8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1d8.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_408.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_408.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_3d8 = (PredefinedIntegerType *)CONCAT44(local_3d8._4_4_,0x51);
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::ValueChangeFunc,std::allocator<slang::ast::builtins::ValueChangeFunc>,slang::parsing::KnownSystemName>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_408.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(ValueChangeFunc **)&local_408,
             (allocator<slang::ast::builtins::ValueChangeFunc> *)&local_3e8,
             (KnownSystemName *)&local_3d8);
  local_1e8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_408.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_1e8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_408.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_1e8);
  if (local_1e8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1e8.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_408.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_408.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_3d8 = (PredefinedIntegerType *)CONCAT44(local_3d8._4_4_,0x52);
  local_3f0 = local_3f0 & ~Shuffle;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::GlobalValueChangeFunc,std::allocator<slang::ast::builtins::GlobalValueChangeFunc>,slang::parsing::KnownSystemName,bool>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_408.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(GlobalValueChangeFunc **)&local_408,
             (allocator<slang::ast::builtins::GlobalValueChangeFunc> *)&local_3e8,
             (KnownSystemName *)&local_3d8,(bool *)&local_3f0);
  local_1f8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_408.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_1f8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_408.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_1f8);
  if (local_1f8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1f8.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_408.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_408.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_3d8 = (PredefinedIntegerType *)CONCAT44(local_3d8._4_4_,0x53);
  local_3f0 = local_3f0 & ~Shuffle;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::GlobalValueChangeFunc,std::allocator<slang::ast::builtins::GlobalValueChangeFunc>,slang::parsing::KnownSystemName,bool>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_408.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(GlobalValueChangeFunc **)&local_408,
             (allocator<slang::ast::builtins::GlobalValueChangeFunc> *)&local_3e8,
             (KnownSystemName *)&local_3d8,(bool *)&local_3f0);
  local_208.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_408.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_208.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_408.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_208);
  if (local_208.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_208.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_408.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_408.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_3d8 = (PredefinedIntegerType *)CONCAT44(local_3d8._4_4_,0x54);
  local_3f0 = local_3f0 & ~Shuffle;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::GlobalValueChangeFunc,std::allocator<slang::ast::builtins::GlobalValueChangeFunc>,slang::parsing::KnownSystemName,bool>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_408.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(GlobalValueChangeFunc **)&local_408,
             (allocator<slang::ast::builtins::GlobalValueChangeFunc> *)&local_3e8,
             (KnownSystemName *)&local_3d8,(bool *)&local_3f0);
  local_218.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_408.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_218.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_408.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_218);
  if (local_218.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_218.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_408.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_408.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_3d8 = (PredefinedIntegerType *)CONCAT44(local_3d8._4_4_,0x55);
  local_3f0 = local_3f0 & ~Shuffle;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::GlobalValueChangeFunc,std::allocator<slang::ast::builtins::GlobalValueChangeFunc>,slang::parsing::KnownSystemName,bool>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_408.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(GlobalValueChangeFunc **)&local_408,
             (allocator<slang::ast::builtins::GlobalValueChangeFunc> *)&local_3e8,
             (KnownSystemName *)&local_3d8,(bool *)&local_3f0);
  local_228.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_408.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_228.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_408.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_228);
  if (local_228.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_228.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_408.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_408.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_3d8 = (PredefinedIntegerType *)CONCAT44(local_3d8._4_4_,0x56);
  local_3f0 = local_3f0 & ~Shuffle;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::GlobalValueChangeFunc,std::allocator<slang::ast::builtins::GlobalValueChangeFunc>,slang::parsing::KnownSystemName,bool>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_408.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(GlobalValueChangeFunc **)&local_408,
             (allocator<slang::ast::builtins::GlobalValueChangeFunc> *)&local_3e8,
             (KnownSystemName *)&local_3d8,(bool *)&local_3f0);
  local_238.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_408.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_238.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_408.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_238);
  if (local_238.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_238.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_408.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_408.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_3d8 = (PredefinedIntegerType *)CONCAT44(local_3d8._4_4_,0x57);
  local_3f0 = CONCAT31(local_3f0._1_3_,1);
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::GlobalValueChangeFunc,std::allocator<slang::ast::builtins::GlobalValueChangeFunc>,slang::parsing::KnownSystemName,bool>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_408.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(GlobalValueChangeFunc **)&local_408,
             (allocator<slang::ast::builtins::GlobalValueChangeFunc> *)&local_3e8,
             (KnownSystemName *)&local_3d8,(bool *)&local_3f0);
  local_248.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_408.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_248.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_408.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_248);
  if (local_248.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_248.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_408.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_408.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_3d8 = (PredefinedIntegerType *)CONCAT44(local_3d8._4_4_,0x58);
  local_3f0 = CONCAT31(local_3f0._1_3_,1);
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::GlobalValueChangeFunc,std::allocator<slang::ast::builtins::GlobalValueChangeFunc>,slang::parsing::KnownSystemName,bool>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_408.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(GlobalValueChangeFunc **)&local_408,
             (allocator<slang::ast::builtins::GlobalValueChangeFunc> *)&local_3e8,
             (KnownSystemName *)&local_3d8,(bool *)&local_3f0);
  local_258.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_408.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_258.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_408.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_258);
  if (local_258.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_258.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_408.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_408.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_3d8 = (PredefinedIntegerType *)CONCAT44(local_3d8._4_4_,0x59);
  local_3f0 = CONCAT31(local_3f0._1_3_,1);
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::GlobalValueChangeFunc,std::allocator<slang::ast::builtins::GlobalValueChangeFunc>,slang::parsing::KnownSystemName,bool>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_408.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(GlobalValueChangeFunc **)&local_408,
             (allocator<slang::ast::builtins::GlobalValueChangeFunc> *)&local_3e8,
             (KnownSystemName *)&local_3d8,(bool *)&local_3f0);
  local_268.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_408.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_268.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_408.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_268);
  if (local_268.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_268.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_408.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_408.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_3d8 = (PredefinedIntegerType *)CONCAT44(local_3d8._4_4_,0x5a);
  local_3f0 = CONCAT31(local_3f0._1_3_,1);
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::GlobalValueChangeFunc,std::allocator<slang::ast::builtins::GlobalValueChangeFunc>,slang::parsing::KnownSystemName,bool>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_408.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(GlobalValueChangeFunc **)&local_408,
             (allocator<slang::ast::builtins::GlobalValueChangeFunc> *)&local_3e8,
             (KnownSystemName *)&local_3d8,(bool *)&local_3f0);
  local_278.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_408.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_278.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_408.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_278);
  if (local_278.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_278.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_408.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_408.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_3d8 = (PredefinedIntegerType *)CONCAT44(local_3d8._4_4_,0x5b);
  local_3f0 = CONCAT31(local_3f0._1_3_,1);
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::GlobalValueChangeFunc,std::allocator<slang::ast::builtins::GlobalValueChangeFunc>,slang::parsing::KnownSystemName,bool>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_408.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(GlobalValueChangeFunc **)&local_408,
             (allocator<slang::ast::builtins::GlobalValueChangeFunc> *)&local_3e8,
             (KnownSystemName *)&local_3d8,(bool *)&local_3f0);
  local_288.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_408.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_288.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_408.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_288);
  if (local_288.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_288.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_408.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_408.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::FErrorFunc,std::allocator<slang::ast::builtins::FErrorFunc>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_408.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(FErrorFunc **)&local_408,
             (allocator<slang::ast::builtins::FErrorFunc> *)&local_3d8);
  local_298.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_408.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_298.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_408.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_298);
  if (local_298.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_298.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_408.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_408.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::FGetsFunc,std::allocator<slang::ast::builtins::FGetsFunc>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_408.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(FGetsFunc **)&local_408,
             (allocator<slang::ast::builtins::FGetsFunc> *)&local_3d8);
  local_2a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_408.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_2a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_408.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_2a8);
  if (local_2a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2a8.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_408.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_408.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_3e8 = (Type *)CONCAT71(local_3e8._1_7_,1);
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::ScanfFunc,std::allocator<slang::ast::builtins::ScanfFunc>,bool>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_408.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(ScanfFunc **)&local_408,
             (allocator<slang::ast::builtins::ScanfFunc> *)&local_3d8,(bool *)&local_3e8);
  local_2b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_408.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_2b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_408.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_2b8);
  if (local_2b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b8.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_408.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_408.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_3e8 = (Type *)((ulong)local_3e8 & 0xffffffffffffff00);
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::ScanfFunc,std::allocator<slang::ast::builtins::ScanfFunc>,bool>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_408.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(ScanfFunc **)&local_408,
             (allocator<slang::ast::builtins::ScanfFunc> *)&local_3d8,(bool *)&local_3e8);
  local_2c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_408.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_2c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_408.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_2c8);
  if (local_2c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2c8.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_408.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_408.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::FReadFunc,std::allocator<slang::ast::builtins::FReadFunc>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_408.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(FReadFunc **)&local_408,
             (allocator<slang::ast::builtins::FReadFunc> *)&local_3d8);
  local_2d8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_408.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_2d8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_408.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_2d8);
  if (local_2d8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2d8.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_408.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_408.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::SampledFunc,std::allocator<slang::ast::builtins::SampledFunc>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_408.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(SampledFunc **)&local_408,
             (allocator<slang::ast::builtins::SampledFunc> *)&local_3d8);
  local_2e8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_408.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_2e8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_408.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_2e8);
  if (local_2e8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2e8.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_408.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_408.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::PastFunc,std::allocator<slang::ast::builtins::PastFunc>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_408.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(PastFunc **)&local_408,
             (allocator<slang::ast::builtins::PastFunc> *)&local_3d8);
  local_2f8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_408.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_2f8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_408.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_2f8);
  if (local_2f8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2f8.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_408.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_408.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_3d8 = (PredefinedIntegerType *)CONCAT44(local_3d8._4_4_,0x6a);
  local_3f0 = CONCAT31(local_3f0._1_3_,1);
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::TimeScaleFunc,std::allocator<slang::ast::builtins::TimeScaleFunc>,slang::parsing::KnownSystemName,bool>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_408.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(TimeScaleFunc **)&local_408,
             (allocator<slang::ast::builtins::TimeScaleFunc> *)&local_3e8,
             (KnownSystemName *)&local_3d8,(bool *)&local_3f0);
  local_308.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_408.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_308.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_408.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_308);
  if (local_308.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_308.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_408.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_408.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_3d8 = (PredefinedIntegerType *)CONCAT44(local_3d8._4_4_,0x6b);
  local_3f0 = CONCAT31(local_3f0._1_3_,1);
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::TimeScaleFunc,std::allocator<slang::ast::builtins::TimeScaleFunc>,slang::parsing::KnownSystemName,bool>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_408.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(TimeScaleFunc **)&local_408,
             (allocator<slang::ast::builtins::TimeScaleFunc> *)&local_3e8,
             (KnownSystemName *)&local_3d8,(bool *)&local_3f0);
  local_318.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_408.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_318.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_408.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_318);
  if (local_318.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_318.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_408.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_408.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_3d8 = (PredefinedIntegerType *)CONCAT44(local_3d8._4_4_,0x6c);
  local_3f0 = local_3f0 & ~Shuffle;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::TimeScaleFunc,std::allocator<slang::ast::builtins::TimeScaleFunc>,slang::parsing::KnownSystemName,bool>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_408.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(TimeScaleFunc **)&local_408,
             (allocator<slang::ast::builtins::TimeScaleFunc> *)&local_3e8,
             (KnownSystemName *)&local_3d8,(bool *)&local_3f0);
  local_328.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_408.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_328.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_408.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_328);
  if (local_328.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_328.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_408.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_408.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::StacktraceFunc,std::allocator<slang::ast::builtins::StacktraceFunc>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_408.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(StacktraceFunc **)&local_408,
             (allocator<slang::ast::builtins::StacktraceFunc> *)&local_3d8);
  local_338.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_408.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_338.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_408.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_338);
  if (local_338.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_338.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_408.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_408.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::CountDriversFunc,std::allocator<slang::ast::builtins::CountDriversFunc>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_408.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(CountDriversFunc **)&local_408,
             (allocator<slang::ast::builtins::CountDriversFunc> *)&local_3d8);
  local_348.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_408.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_348.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_408.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_348);
  if (local_348.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_348.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_408.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_408.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::GetPatternFunc,std::allocator<slang::ast::builtins::GetPatternFunc>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_408.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(GetPatternFunc **)&local_408,
             (allocator<slang::ast::builtins::GetPatternFunc> *)&local_3d8);
  local_358.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_408.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_358.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_408.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_358);
  if (local_358.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_358.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_408.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_408.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::TestPlusArgsFunction,std::allocator<slang::ast::builtins::TestPlusArgsFunction>,slang::ast::builtins::Builtins&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_408.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(TestPlusArgsFunction **)&local_408,
             (allocator<slang::ast::builtins::TestPlusArgsFunction> *)&local_3d8,this);
  local_368.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_408.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_368.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_408.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_368);
  if (local_368.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_368.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_408.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_408.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_3e8 = (Type *)CONCAT44(local_3e8._4_4_,0x3e);
  local_3f0 = Unknown;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3ea = 1;
  local_3d8 = (PredefinedIntegerType *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::NonConstantFunction,std::allocator<slang::ast::NonConstantFunction>,slang::parsing::KnownSystemName,slang::ast::ScalarType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>,bool>
            (&_Stack_3d0,(NonConstantFunction **)&local_3d8,
             (allocator<slang::ast::NonConstantFunction> *)&local_3b4,(KnownSystemName *)&local_3e8,
             &this->bitType,(int *)&local_3f0,&local_408,(bool *)&local_3ea);
  local_378.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_3d8;
  local_378.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = _Stack_3d0._M_pi;
  local_3d8 = (PredefinedIntegerType *)0x0;
  _Stack_3d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemMethod(this,EventType,&local_378);
  if (local_378.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_378.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (_Stack_3d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_3d0._M_pi);
  }
  if (local_408.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_408.
                    super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_408.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_408.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_3d8 = (PredefinedIntegerType *)CONCAT44(local_3d8._4_4_,0x11c);
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::RandModeFunc,std::allocator<slang::ast::builtins::RandModeFunc>,slang::parsing::KnownSystemName>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_408.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(RandModeFunc **)&local_408,
             (allocator<slang::ast::builtins::RandModeFunc> *)&local_3e8,
             (KnownSystemName *)&local_3d8);
  local_388.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_408.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_388.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_408.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemMethod(this,ClassProperty,&local_388);
  if (local_388.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_388.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_408.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_408.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_3d8 = (PredefinedIntegerType *)CONCAT44(local_3d8._4_4_,0x11d);
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::RandModeFunc,std::allocator<slang::ast::builtins::RandModeFunc>,slang::parsing::KnownSystemName>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_408.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(RandModeFunc **)&local_408,
             (allocator<slang::ast::builtins::RandModeFunc> *)&local_3e8,
             (KnownSystemName *)&local_3d8);
  local_398.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_408.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_398.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_408.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_408.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemMethod(this,ConstraintBlock,&local_398);
  if (local_398.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_398.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_408.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_408.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_3b0.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3b0.
                    super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_3b0.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3b0.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Builtins::registerNonConstFuncs() {
    using parsing::KnownSystemName;

#define REGISTER(...) addSystemSubroutine(std::make_shared<NonConstantFunction>(__VA_ARGS__))

    std::vector<const Type*> intArg = {&intType};

    REGISTER(KnownSystemName::Time, timeType);
    REGISTER(KnownSystemName::STime, uintType);
    REGISTER(KnownSystemName::RealTime, realTimeType);
    REGISTER(KnownSystemName::Random, intType, 0, intArg);
    REGISTER(KnownSystemName::URandom, uintType, 0, intArg);
    REGISTER(KnownSystemName::URandomRange, uintType, 1,
             std::vector<const Type*>{&uintType, &uintType});

    REGISTER(KnownSystemName::FOpen, intType, 1,
             std::vector<const Type*>{&stringType, &stringType});
    REGISTER(KnownSystemName::FClose, voidType, 1, intArg);
    REGISTER(KnownSystemName::FGetC, intType, 1, intArg);
    REGISTER(KnownSystemName::UngetC, intType, 2, std::vector<const Type*>{&intType, &intType});
    REGISTER(KnownSystemName::FTell, intType, 1, intArg);
    REGISTER(KnownSystemName::FSeek, intType, 3,
             std::vector<const Type*>{&intType, &intType, &intType});
    REGISTER(KnownSystemName::Rewind, intType, 1, intArg);
    REGISTER(KnownSystemName::FFlush, voidType, 0, intArg);
    REGISTER(KnownSystemName::FEof, intType, 1, intArg);

    REGISTER(KnownSystemName::ResetCount, intType, 0);
    REGISTER(KnownSystemName::ResetValue, intType, 0);

#undef REGISTER

#define FUNC(name, numArgs) addSystemSubroutine(std::make_shared<DistributionFunc>(name, numArgs))
    FUNC(KnownSystemName::DistUniform, 3);
    FUNC(KnownSystemName::DistNormal, 3);
    FUNC(KnownSystemName::DistExponential, 2);
    FUNC(KnownSystemName::DistPoisson, 2);
    FUNC(KnownSystemName::DistChiSquare, 2);
    FUNC(KnownSystemName::DistT, 2);
    FUNC(KnownSystemName::DistErlang, 3);
#undef FUNC

#define FUNC(name) addSystemSubroutine(std::make_shared<ValueChangeFunc>(name))
    FUNC(KnownSystemName::Rose);
    FUNC(KnownSystemName::Fell);
    FUNC(KnownSystemName::Stable);
    FUNC(KnownSystemName::Changed);
#undef FUNC

#define FUNC(name, isFuture) \
    addSystemSubroutine(std::make_shared<GlobalValueChangeFunc>(name, isFuture))
    FUNC(KnownSystemName::PastGclk, false);
    FUNC(KnownSystemName::RoseGclk, false);
    FUNC(KnownSystemName::FellGclk, false);
    FUNC(KnownSystemName::StableGclk, false);
    FUNC(KnownSystemName::ChangedGclk, false);
    FUNC(KnownSystemName::FutureGclk, true);
    FUNC(KnownSystemName::RisingGclk, true);
    FUNC(KnownSystemName::FallingGclk, true);
    FUNC(KnownSystemName::SteadyGclk, true);
    FUNC(KnownSystemName::ChangingGclk, true);
#undef FUNC

    addSystemSubroutine(std::make_shared<FErrorFunc>());
    addSystemSubroutine(std::make_shared<FGetsFunc>());
    addSystemSubroutine(std::make_shared<ScanfFunc>(true));
    addSystemSubroutine(std::make_shared<ScanfFunc>(false));
    addSystemSubroutine(std::make_shared<FReadFunc>());
    addSystemSubroutine(std::make_shared<SampledFunc>());
    addSystemSubroutine(std::make_shared<PastFunc>());
    addSystemSubroutine(std::make_shared<TimeScaleFunc>(KnownSystemName::TimeUnit, true));
    addSystemSubroutine(std::make_shared<TimeScaleFunc>(KnownSystemName::TimePrecision, true));
    addSystemSubroutine(std::make_shared<TimeScaleFunc>(KnownSystemName::Scale, false));
    addSystemSubroutine(std::make_shared<StacktraceFunc>());
    addSystemSubroutine(std::make_shared<CountDriversFunc>());
    addSystemSubroutine(std::make_shared<GetPatternFunc>());
    addSystemSubroutine(std::make_shared<TestPlusArgsFunction>(*this));

    addSystemMethod(SymbolKind::EventType,
                    std::make_shared<NonConstantFunction>(KnownSystemName::Triggered, bitType, 0,
                                                          std::vector<const Type*>{},
                                                          /* isMethod */ true));

    addSystemMethod(SymbolKind::ClassProperty,
                    std::make_shared<RandModeFunc>(KnownSystemName::RandMode));
    addSystemMethod(SymbolKind::ConstraintBlock,
                    std::make_shared<RandModeFunc>(KnownSystemName::ConstraintMode));
}